

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O0

long __thiscall Samba::go(Samba *this)

{
  int iVar1;
  pointer pSVar2;
  SambaError *this_00;
  undefined4 extraout_var;
  uint in_ESI;
  char local_1f [8];
  uint8_t cmd [11];
  uint32_t addr_local;
  Samba *this_local;
  
  cmd._3_4_ = in_ESI;
  unique0x10000144 = this;
  if ((this->_debug & 1U) != 0) {
    printf("%s(addr=%#x)\n","go",(ulong)in_ESI);
  }
  snprintf(local_1f,0xb,"G%08X#",(ulong)(uint)cmd._3_4_);
  pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port);
  iVar1 = (*pSVar2->_vptr_SerialPort[6])(pSVar2,local_1f,10);
  if (iVar1 != 10) {
    this_00 = (SambaError *)__cxa_allocate_exception(8);
    SambaError::SambaError(this_00);
    __cxa_throw(this_00,&SambaError::typeinfo,SambaError::~SambaError);
  }
  if ((this->_isUsb & 1U) != 0) {
    pSVar2 = std::unique_ptr<SerialPort,_std::default_delete<SerialPort>_>::operator->(&this->_port)
    ;
    iVar1 = (*pSVar2->_vptr_SerialPort[10])();
    this = (Samba *)CONCAT44(extraout_var,iVar1);
  }
  return (long)this;
}

Assistant:

void
Samba::go(uint32_t addr)
{
    uint8_t cmd[11];

    if (_debug)
        printf("%s(addr=%#x)\n", __FUNCTION__, addr);

    snprintf((char*) cmd, sizeof(cmd), "G%08X#", addr);
    if (_port->write(cmd, sizeof(cmd) - 1) != sizeof(cmd) - 1)
        throw SambaError();

    // The SAM firmware can get confused if another command is
    // received in the same USB data packet as the go command
    // so we flush after writing the command over USB.
    if (_isUsb)
        _port->flush();
}